

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

void __thiscall
cs_impl::any::holder<cs::callable>::holder<cs_impl::cni,cs::callable::types>
          (holder<cs::callable> *this,cni *args,types *args_1)

{
  types tVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0032d288;
  std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>::
  function<cs_impl::cni,void>
            ((function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)> *)
             &local_38,args);
  tVar1 = *args_1;
  *(undefined8 *)&(this->mDat).mFunc.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mDat).mFunc.super__Function_base._M_functor + 8) = 0;
  (this->mDat).mFunc.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mDat).mFunc._M_invoker = local_20;
  if (local_28 != (_Manager_type)0x0) {
    *(undefined8 *)&(this->mDat).mFunc.super__Function_base._M_functor = local_38;
    *(undefined8 *)((long)&(this->mDat).mFunc.super__Function_base._M_functor + 8) = uStack_30;
    (this->mDat).mFunc.super__Function_base._M_manager = local_28;
  }
  (this->mDat).mType = tVar1;
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}